

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-json.c
# Opt level: O2

void test_bson_json_empty_final_object(void)

{
  uint uVar1;
  char cVar2;
  int iVar3;
  int __fd;
  long lVar4;
  void *__buf;
  void *__buf_00;
  void *__s1;
  void *__s2;
  undefined8 uVar5;
  undefined8 uVar6;
  ulong uVar7;
  uint uVar8;
  char *pcVar9;
  ulong uVar10;
  bson_t b;
  bson_error_t error;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 local_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 local_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 local_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 local_310;
  undefined8 uStack_308;
  undefined1 local_2b8 [8];
  undefined1 local_2b0 [640];
  
  lVar4 = bcon_new(0,"a","{","b","{","}","}",0);
  local_310 = 0;
  uStack_308 = 0;
  local_320 = 0;
  uStack_318 = 0;
  local_330 = 0;
  uStack_328 = 0;
  local_340 = 0;
  uStack_338 = 0;
  local_350 = 0;
  uStack_348 = 0;
  local_360 = 0;
  uStack_358 = 0;
  local_370 = 0;
  uStack_368 = 0;
  local_380 = 0x500000003;
  uStack_378 = 5;
  cVar2 = bson_init_from_json(&local_380,"{\"a\": {\"b\": {}}}",0xffffffffffffffff,local_2b8);
  if (cVar2 == '\0') {
    fprintf(_stderr,"%s\n",local_2b0);
    pcVar9 = "r";
    uVar5 = 0x8f2;
  }
  else {
    __buf = (void *)bson_get_data(&local_380);
    __buf_00 = (void *)bson_get_data(lVar4);
    if (*(int *)(lVar4 + 4) == local_380._4_4_) {
      __s1 = (void *)bson_get_data(lVar4);
      __s2 = (void *)bson_get_data(&local_380);
      iVar3 = bcmp(__s1,__s2,(ulong)*(uint *)(lVar4 + 4));
      if (iVar3 == 0) {
        bson_destroy(&local_380);
        bson_destroy(lVar4);
        return;
      }
    }
    uVar5 = bson_as_canonical_extended_json(&local_380,0);
    uVar6 = bson_as_canonical_extended_json(lVar4,0);
    uVar1 = *(uint *)(lVar4 + 4);
    for (uVar10 = 0; (local_380._4_4_ != (uint)uVar10 && ((uint)uVar10 < uVar1));
        uVar10 = uVar10 + 1) {
      if (*(char *)((long)__buf + uVar10) != *(char *)((long)__buf_00 + uVar10)) {
        uVar10 = uVar10 & 0xffffffff;
        goto LAB_001278cc;
      }
    }
    uVar8 = local_380._4_4_;
    if (local_380._4_4_ < uVar1) {
      uVar8 = uVar1;
    }
    uVar10 = (ulong)(uVar8 - 1);
LAB_001278cc:
    fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar10,uVar5,uVar6);
    iVar3 = open("failure.bad.bson",0x42,0x1a0);
    __fd = open("failure.expected.bson",0x42,0x1a0);
    if (iVar3 == -1) {
      pcVar9 = "fd1 != -1";
    }
    else if (__fd == -1) {
      pcVar9 = "fd2 != -1";
    }
    else {
      uVar10 = local_380 >> 0x20;
      uVar7 = write(iVar3,__buf,uVar10);
      if (uVar7 == uVar10) {
        uVar1 = *(uint *)(lVar4 + 4);
        uVar10 = write(__fd,__buf_00,(ulong)uVar1);
        if (uVar10 == uVar1) {
          close(iVar3);
          close(__fd);
          pcVar9 = "0";
        }
        else {
          pcVar9 = "(bson)->len == bson_write (fd2, expected_data, (bson)->len)";
        }
      }
      else {
        pcVar9 = "(&b)->len == bson_write (fd1, bson_data, (&b)->len)";
      }
    }
    uVar5 = 0x8f3;
  }
  fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
          uVar5,"test_bson_json_empty_final_object",pcVar9);
  abort();
}

Assistant:

static void
test_bson_json_empty_final_object (void)
{
   const char *json = "{\"a\": {\"b\": {}}}";
   bson_t *bson = BCON_NEW ("a", "{", "b", "{", "}", "}");
   bson_t b = BSON_INITIALIZER;
   bool r;
   bson_error_t error;

   r = bson_init_from_json (&b, json, -1, &error);
   if (!r) {
      fprintf (stderr, "%s\n", error.message);
   }

   BSON_ASSERT (r);
   bson_eq_bson (&b, bson);

   bson_destroy (&b);
   bson_destroy (bson);
}